

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::AbsoluteDifference
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  byte bVar1;
  uchar uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uchar *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  uchar *puVar9;
  uchar *puVar10;
  byte *pbVar11;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  ImageTemplate<unsigned_char> *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *in2X;
  uint8_t *in1X;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *in2Y;
  uint8_t *in1Y;
  uint32_t rowSizeOut;
  uint32_t rowSize2;
  uint32_t rowSize1;
  uint8_t colorCount;
  ImageTemplate<unsigned_char> *image;
  int iVar12;
  undefined4 in_stack_fffffffffffffee4;
  int iVar13;
  undefined4 in_stack_fffffffffffffef4;
  int iVar14;
  undefined4 in_stack_fffffffffffffefc;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff20;
  byte *local_d8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff68;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  uint32_t *in_stack_ffffffffffffff78;
  uint32_t *in_stack_ffffffffffffff80;
  
  image = in_stack_00000008;
  iVar12 = in_stack_00000010;
  iVar13 = in_stack_00000020;
  iVar14 = in_stack_00000028;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff20,(uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c
             ,in_stack_ffffffffffffff08,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  bVar1 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (in_stack_ffffffffffffff00,
                     (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffefc,iVar14),
                     (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffef4,iVar13));
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffee4,iVar12),image);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffee4,iVar12),image);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x134ed9);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x134ee6);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_stack_00000008);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  pbVar7 = puVar6 + (ulong)(in_ESI * (uint)bVar1) + (ulong)(in_EDX * uVar3);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  pbVar8 = puVar6 + (ulong)(in_R8D * (uint)bVar1) + (ulong)(in_R9D * uVar4);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_stack_00000008);
  puVar6 = puVar6 + (ulong)(in_stack_00000010 * (uint)bVar1) + (ulong)(in_stack_00000018 * uVar5);
  puVar9 = puVar6 + in_stack_00000028 * uVar5;
  for (; puVar6 != puVar9; puVar6 = puVar6 + uVar5) {
    local_d8 = pbVar8;
    pbVar11 = pbVar7;
    for (puVar10 = puVar6; puVar10 != puVar6 + in_stack_00000020 * (uint)bVar1;
        puVar10 = puVar10 + 1) {
      if (*pbVar11 < *local_d8) {
        uVar2 = *local_d8 - *pbVar11;
      }
      else {
        uVar2 = *pbVar11 - *local_d8;
      }
      *puVar10 = uVar2;
      pbVar11 = pbVar11 + 1;
      local_d8 = local_d8 + 1;
    }
    pbVar7 = pbVar7 + uVar3;
    pbVar8 = pbVar8 + uVar4;
  }
  return;
}

Assistant:

void AbsoluteDifference( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                             Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in1, in2, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSize1   = in1.rowSize();
        const uint32_t rowSize2   = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSize1   + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSize2   + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSize1, in2Y += rowSize2 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                (*outX) = static_cast<uint8_t>( (*in2X) > (*in1X) ? (*in2X) - (*in1X) : (*in1X) - (*in2X) );
        }
    }